

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * mergematches(match a,matches *b)

{
  int iVar1;
  int iVar2;
  expr *peVar3;
  int iVar4;
  ull uVar5;
  ull uVar6;
  ull uVar7;
  ull uVar8;
  int iVar9;
  matches *pmVar10;
  long lVar11;
  reloc *prVar12;
  match *pmVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int local_e8 [2];
  ulong local_e0;
  ulong uStack_d8;
  ulong local_d0;
  ulong uStack_c8;
  undefined8 local_b8 [16];
  int local_38;
  
  pmVar10 = (matches *)calloc(0x10,1);
  iVar9 = a.nrelocs;
  uVar8 = a.m[1];
  uVar7 = a.m[0];
  uVar6 = a.a[1];
  uVar5 = a.a[0];
  iVar4 = a.oplen;
  if (0 < b->mnum) {
    uVar17 = (ulong)(uint)a.nrelocs;
    lVar18 = 0x18;
    lVar16 = 0;
    do {
      lVar11 = 0;
      do {
        if ((*(ulong *)((long)b->m->a + lVar11 * 8 + lVar18 + -8) & a.m[lVar11] &
            (*(ulong *)((long)b->m->a + lVar11 * 8 + lVar18 + -0x18) ^ a.a[lVar11])) != 0)
        goto LAB_0016e631;
        lVar11 = lVar11 + 1;
      } while (lVar11 == 1);
      lVar11 = 2;
LAB_0016e631:
      if ((int)lVar11 == 2) {
        memcpy(local_e8,b->m + lVar16,0xb8);
        if (local_e8[0] == 0) {
          local_e8[0] = iVar4;
        }
        local_e0 = local_e0 | uVar5;
        uStack_d8 = uStack_d8 | uVar6;
        local_d0 = local_d0 | uVar7;
        uStack_c8 = uStack_c8 | uVar8;
        if (8 < local_38 + iVar9) {
          __assert_fail("a.nrelocs + nm.nrelocs <= 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/polachok[P]envytools/envydis/core.c"
                        ,0x6b,"struct matches *mergematches(struct match, struct matches *)");
        }
        if (0 < iVar9) {
          uVar15 = 0;
          prVar12 = a.relocs;
          do {
            lVar11 = (long)local_38;
            peVar3 = prVar12->expr;
            local_b8[(lVar11 + uVar15) * 2] = prVar12->bf;
            local_b8[(lVar11 + uVar15) * 2 + 1] = peVar3;
            uVar15 = uVar15 + 1;
            prVar12 = prVar12 + 1;
          } while (uVar17 != uVar15);
        }
        local_38 = local_38 + iVar9;
        iVar1 = pmVar10->mnum;
        iVar2 = pmVar10->mmax;
        if (iVar2 <= iVar1) {
          iVar14 = iVar2 * 2;
          if (iVar2 == 0) {
            iVar14 = 0x10;
          }
          pmVar10->mmax = iVar14;
          pmVar13 = (match *)realloc(pmVar10->m,(long)iVar14 * 0xb8);
          pmVar10->m = pmVar13;
        }
        pmVar10->mnum = iVar1 + 1;
        memcpy(pmVar10->m + iVar1,local_e8,0xb8);
      }
      lVar16 = lVar16 + 1;
      lVar18 = lVar18 + 0xb8;
    } while (lVar16 < b->mnum);
  }
  free(b->m);
  free(b);
  return pmVar10;
}

Assistant:

struct matches *mergematches(struct match a, struct matches *b) {
	struct matches *res = emptymatches();
	int i, j;
	for (i = 0; i < b->mnum; i++) {
		for (j = 0; j < MAXOPLEN; j++) {
			ull cmask = a.m[j] & b->m[i].m[j];
			if ((a.a[j] & cmask) != (b->m[i].a[j] & cmask))
				break;
		}
		if (j == MAXOPLEN) {
			struct match nm = b->m[i];
			if (!nm.oplen)
				nm.oplen = a.oplen;
			for (j = 0; j < MAXOPLEN; j++) {
				nm.a[j] |= a.a[j];
				nm.m[j] |= a.m[j];
			}
			int j;
			assert (a.nrelocs + nm.nrelocs <= 8);
			for (j = 0; j < a.nrelocs; j++)
				nm.relocs[nm.nrelocs + j] = a.relocs[j];
			nm.nrelocs += a.nrelocs;
			ADDARRAY(res->m, nm);
		}
	}
	free(b->m);
	free(b);
	return res;
}